

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_firstwrite(Curl_easy *data,connectdata *conn,_Bool *done)

{
  _Bool _Var1;
  SingleRequest *k;
  _Bool *done_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if ((data->req).newurl != (char *)0x0) {
    if ((*(uint *)&(conn->bits).field_0x4 >> 6 & 1) != 0) {
      (data->req).keepon = (data->req).keepon & 0xfffffffe;
      *done = true;
      return CURLE_OK;
    }
    *(ushort *)&(data->req).field_0xd9 = *(ushort *)&(data->req).field_0xd9 & 0xfff7 | 8;
    Curl_infof(data,"Ignoring the response-body");
  }
  if (((((data->state).resume_from == 0) || ((*(ushort *)&(data->req).field_0xd9 >> 1 & 1) != 0)) ||
      ((data->state).httpreq != '\0')) || ((*(ushort *)&(data->req).field_0xd9 >> 3 & 1) != 0)) {
    if ((((data->set).timecondition == '\0') || ((data->state).range != (char *)0x0)) ||
       (_Var1 = Curl_meets_timecondition(data,(data->req).timeofdoc), _Var1)) {
      data_local._4_4_ = CURLE_OK;
    }
    else {
      *done = true;
      (data->info).httpcode = 0x130;
      Curl_infof(data,"Simulate a HTTP 304 response");
      Curl_conncontrol(conn,2);
      data_local._4_4_ = CURLE_OK;
    }
  }
  else if ((data->req).size == (data->state).resume_from) {
    Curl_infof(data,"The entire document is already downloaded");
    Curl_conncontrol(conn,2);
    (data->req).keepon = (data->req).keepon & 0xfffffffe;
    *done = true;
    data_local._4_4_ = CURLE_OK;
  }
  else {
    Curl_failf(data,"HTTP server doesn\'t seem to support byte ranges. Cannot resume.");
    data_local._4_4_ = CURLE_RANGE_ERROR;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_http_firstwrite(struct Curl_easy *data,
                              struct connectdata *conn,
                              bool *done)
{
  struct SingleRequest *k = &data->req;

  if(data->req.newurl) {
    if(conn->bits.close) {
      /* Abort after the headers if "follow Location" is set
         and we're set to close anyway. */
      k->keepon &= ~KEEP_RECV;
      *done = TRUE;
      return CURLE_OK;
    }
    /* We have a new url to load, but since we want to be able to re-use this
       connection properly, we read the full response in "ignore more" */
    k->ignorebody = TRUE;
    infof(data, "Ignoring the response-body");
  }
  if(data->state.resume_from && !k->content_range &&
     (data->state.httpreq == HTTPREQ_GET) &&
     !k->ignorebody) {

    if(k->size == data->state.resume_from) {
      /* The resume point is at the end of file, consider this fine even if it
         doesn't allow resume from here. */
      infof(data, "The entire document is already downloaded");
      streamclose(conn, "already downloaded");
      /* Abort download */
      k->keepon &= ~KEEP_RECV;
      *done = TRUE;
      return CURLE_OK;
    }

    /* we wanted to resume a download, although the server doesn't seem to
     * support this and we did this with a GET (if it wasn't a GET we did a
     * POST or PUT resume) */
    failf(data, "HTTP server doesn't seem to support "
          "byte ranges. Cannot resume.");
    return CURLE_RANGE_ERROR;
  }

  if(data->set.timecondition && !data->state.range) {
    /* A time condition has been set AND no ranges have been requested. This
       seems to be what chapter 13.3.4 of RFC 2616 defines to be the correct
       action for a HTTP/1.1 client */

    if(!Curl_meets_timecondition(data, k->timeofdoc)) {
      *done = TRUE;
      /* We're simulating a http 304 from server so we return
         what should have been returned from the server */
      data->info.httpcode = 304;
      infof(data, "Simulate a HTTP 304 response");
      /* we abort the transfer before it is completed == we ruin the
         re-use ability. Close the connection */
      streamclose(conn, "Simulated 304 handling");
      return CURLE_OK;
    }
  } /* we have a time condition */

  return CURLE_OK;
}